

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O1

void __thiscall MeshLib::SolidDelegate::removeFace(SolidDelegate *this,Solid *pS,Face *f)

{
  int *piVar1;
  Node<MeshLib::Edge> *pNVar2;
  Edge *e;
  pointer pcVar3;
  TreeIterator<MeshLib::Edge> *pTVar4;
  Node<MeshLib::Face> *pNVar5;
  int iVar6;
  TreeIterator<MeshLib::Edge> *pTVar7;
  SolidEdgeIterator eiter;
  TreeIterator<MeshLib::Edge> local_148;
  
  pTVar7 = (TreeIterator<MeshLib::Edge> *)f->m_halfedge;
  iVar6 = 0;
  do {
    pTVar7 = (TreeIterator<MeshLib::Edge> *)pTVar7->m_stack[2];
    pNVar2 = pTVar7->m_stack[0];
    if (*(TreeIterator<MeshLib::Edge> **)&pNVar2[2].height == pTVar7) {
      this = (SolidDelegate *)&local_148;
      AVL::TreeIterator<MeshLib::Edge>::TreeIterator(&local_148,&pS->m_edges);
      while (local_148.m_finished == false) {
        pTVar4 = (TreeIterator<MeshLib::Edge> *)(local_148.m_pointer)->data->m_halfedge[0];
        if (((pTVar4 != pTVar7) && (pTVar4->m_stack[0] == pNVar2)) ||
           ((pTVar4 = (TreeIterator<MeshLib::Edge> *)(local_148.m_pointer)->data->m_halfedge[1],
            pTVar4 != (TreeIterator<MeshLib::Edge> *)0x0 &&
            ((pTVar4 != pTVar7 && (pTVar4->m_stack[0] == pNVar2)))))) {
          *(TreeIterator<MeshLib::Edge> **)&pNVar2[2].height = pTVar4;
          break;
        }
        this = (SolidDelegate *)&local_148;
        AVL::TreeIterator<MeshLib::Edge>::operator++(&local_148);
      }
    }
    if (*(TreeIterator<MeshLib::Edge> **)&pNVar2[2].height == pTVar7) {
      *(undefined8 *)&pNVar2[2].height = 0;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 3) {
      iVar6 = 3;
      do {
        e = *(Edge **)pTVar7;
        pTVar4 = (TreeIterator<MeshLib::Edge> *)pTVar7->m_stack[2];
        if (e->m_halfedge[1] == (HalfEdge *)0x0) {
          removeEdge(this,pS,e);
          pcVar3 = (e->m_string)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &(e->m_string).field_2) {
            operator_delete(pcVar3);
          }
          operator_delete(e);
          if (pTVar7->m_stack[3] != (Node<MeshLib::Edge> *)(pTVar7->m_stack + 5)) {
            operator_delete(pTVar7->m_stack[3]);
          }
          operator_delete(pTVar7);
        }
        else {
          if ((TreeIterator<MeshLib::Edge> *)e->m_halfedge[0] == pTVar7) {
            e->m_halfedge[0] = e->m_halfedge[1];
          }
          if (pTVar7->m_stack[3] != (Node<MeshLib::Edge> *)(pTVar7->m_stack + 5)) {
            operator_delete(pTVar7->m_stack[3]);
          }
          operator_delete(pTVar7);
          e->m_halfedge[1] = (HalfEdge *)0x0;
        }
        iVar6 = iVar6 + -1;
        this = (SolidDelegate *)pTVar7;
        pTVar7 = pTVar4;
      } while (iVar6 != 0);
      pNVar5 = AVL::Node<MeshLib::Face>::remove_node((pS->m_faces).root,f);
      (pS->m_faces).root = pNVar5;
      if (pNVar5 != (Node<MeshLib::Face> *)0x0) {
        piVar1 = &(pS->m_faces).size;
        *piVar1 = *piVar1 + -1;
      }
      return;
    }
  } while( true );
}

Assistant:

void SolidDelegate::removeFace (Solid * pS, Face * f) 
{
	int i;
	HalfEdge * he = f->halfedge ();
	for(i=0; i<3; i++)
	{
		he = he->he_next ();
		Vertex * v = he->target ();
		if(v->halfedge () == he)
		{
			for(SolidEdgeIterator eiter(pS); !eiter.end (); ++eiter)
			{
				Edge * e = *eiter;
				HalfEdge * hhe = e->halfedge (0);
				if(hhe->target () == v && hhe != he)
				{
					v->halfedge () = hhe;
					break;
				}
				else if (e->halfedge (1) != NULL && e->halfedge (1)->target () == v && e->halfedge (1) != he)
				{
					v->halfedge () = e->halfedge (1);
					break;
				}
			}
		}
		if(v->halfedge () == he)
			v->halfedge () = NULL;
	}
	for(i=0; i<3; i++)
	{
		HalfEdge * nhe = he->he_next ();
	//	Vertex * v = he->target ();
		Edge * e = he->edge ();
		if(e->halfedge (1) == NULL)
		{
			removeEdge(pS, e);
			delete e;
			delete he;
		}
		else
		{
			if(e->halfedge (0) == he)
				e->halfedge (0) = e->halfedge (1);
			delete he;
			e->halfedge(1) = NULL;
		}
		he = nhe;
	}

	pS->m_faces.remove(f);
}